

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::new_block_index
          (ImplicitProducer *this)

{
  __int_type _Var1;
  long lVar2;
  __pointer_type pBVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  long in_RDI;
  size_t i_1;
  size_t i;
  __int_type prevPos;
  __int_type prevTail;
  BlockIndexEntry **index;
  BlockIndexEntry *entries;
  BlockIndexHeader *header;
  char *raw;
  size_t entryCount;
  size_t prevCapacity;
  __pointer_type prev;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order in_stack_ffffffffffffff04;
  __pointer_type in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  size_t local_d8;
  size_t local_d0;
  size_t local_c0;
  long local_b8;
  __int_type local_b0;
  bool local_59;
  
  pBVar3 = std::
           atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
           ::load((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
                   *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  if (pBVar3 == (__pointer_type)0x0) {
    local_d0 = 0;
    local_d8 = *(size_t *)(in_RDI + 0x58);
  }
  else {
    local_d8 = pBVar3->capacity;
    local_d0 = local_d8;
  }
  puVar4 = (undefined8 *)
           ConcurrentQueueDefaultTraits::malloc
                     (local_d8 * 0x10 + 0x36 + *(long *)(in_RDI + 0x58) * 8);
  if (puVar4 == (undefined8 *)0x0) {
    local_59 = false;
  }
  else {
    pcVar5 = details::
             align_for<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ImplicitProducer::BlockIndexEntry>
                       ((char *)(puVar4 + 5));
    pcVar6 = details::
             align_for<moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ImplicitProducer::BlockIndexEntry*>
                       (pcVar5 + local_d8 * 0x10);
    if (pBVar3 != (__pointer_type)0x0) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      _Var1 = (pBVar3->tail).super___atomic_base<unsigned_long>._M_i;
      local_b8 = 0;
      local_b0 = _Var1;
      do {
        local_b0 = local_b0 + 1 & pBVar3->capacity - 1;
        *(BlockIndexEntry **)(pcVar6 + local_b8 * 8) = pBVar3->index[local_b0];
        local_b8 = local_b8 + 1;
      } while (local_b0 != _Var1);
    }
    for (local_c0 = 0; local_c0 != local_d8; local_c0 = local_c0 + 1) {
      in_stack_ffffffffffffff08 = (__pointer_type)(pcVar5 + local_c0 * 0x10);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      in_stack_ffffffffffffff14 = 0;
      ((__base_type *)&in_stack_ffffffffffffff08->capacity)->_M_p = (__pointer_type)0x1;
      *(char **)(pcVar6 + (local_d0 + local_c0) * 8) = pcVar5 + local_c0 * 0x10;
    }
    puVar4[4] = pBVar3;
    puVar4[2] = pcVar5;
    puVar4[3] = pcVar6;
    *puVar4 = *(undefined8 *)(in_RDI + 0x58);
    lVar2 = *(long *)(in_RDI + 0x58);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    puVar4[1] = local_d0 - 1 & lVar2 - 1U;
    std::
    atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
    ::store((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ImplicitProducer::BlockIndexHeader_*>
             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
            in_stack_ffffffffffffff08,memory_order_relaxed);
    *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) << 1;
    local_59 = true;
  }
  return local_59;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}